

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attr.c
# Opt level: O0

int set_opaque_attr(attr_list list,atom_t attr_id,int length,char *buffer)

{
  attr_union value_00;
  attr_union value_01;
  int iVar1;
  attr_list in_RCX;
  attr_value_type in_EDX;
  undefined4 in_ESI;
  undefined8 in_RDI;
  attr_union value;
  atom_t in_stack_ffffffffffffffd4;
  attr_list list_00;
  undefined4 local_4;
  
  value_00.u._8_4_ = in_EDX;
  value_00.u.l = (ssize_t)in_RCX;
  value_00.u._12_4_ = in_ESI;
  list_00 = in_RCX;
  iVar1 = replace_pattr(in_RCX,in_stack_ffffffffffffffd4,in_EDX,value_00);
  if (iVar1 == 0) {
    value_01.u.l._4_4_ = in_ESI;
    value_01.u.i = in_EDX;
    value_01.u.o.buffer = (void *)in_RDI;
    local_4 = add_pattr(list_00,(atom_t)((ulong)in_RCX >> 0x20),(attr_value_type)in_RCX,value_01);
  }
  else {
    local_4 = 1;
  }
  return local_4;
}

Assistant:

extern int 
set_opaque_attr(attr_list list, atom_t attr_id, int length, char *buffer)
{
    attr_union value;
    value.u.o.length = length;
    value.u.o.buffer = buffer;
    if (replace_pattr(list, attr_id, Attr_String, value) == 0) {
	return add_pattr(list, attr_id, Attr_String, value);
    }
    return 1;
}